

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  char cVar2;
  int i;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  _InputArray *p_Var7;
  iterator iVar8;
  mapped_type *this;
  _Base_ptr p_Var9;
  char *pcVar10;
  int j;
  long lVar11;
  long lVar12;
  int in_R8D;
  int t;
  ulong uVar13;
  _Self __tmp;
  double dVar14;
  int bStep;
  int aStep;
  int lStep;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  string s;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> shadowPoints;
  map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
  labMap;
  Mat maskAvgL;
  int local_820;
  int iStack_81c;
  undefined8 *local_7e8;
  long *local_7e0;
  Mat maskFinal;
  undefined1 auStack_7c4 [12];
  Mat *pMStack_7c0;
  long *local_780;
  Mat imgL;
  long local_758;
  undefined8 *local_728;
  long *local_720;
  _Vector_base<int,_std::allocator<int>_> local_708;
  time_t end_time;
  MatExpr *local_6e0;
  Size local_6d8;
  Size local_6d0;
  Size local_6c8;
  string srcPath;
  stringstream sstm;
  _Head_base<1UL,_int,_false> _Stack_69c;
  Mat *local_698;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_690 [15];
  Mat imgB;
  long local_508;
  long *local_4d0;
  Mat imgA;
  long local_4a8;
  long *local_470;
  Mat stdDevL;
  double *local_448;
  Mat meanL;
  double *local_3e8;
  Mat imgLD;
  long *local_350;
  Mat bFiltered;
  Mat aFiltered;
  Mat lFiltered;
  Mat imgRGB;
  Mat imgLAB;
  _InputArray local_158 [4];
  Mat local_f8 [96];
  Mat local_98 [104];
  
  if (argc == 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&srcPath,argv[1],(allocator<char> *)&sstm);
    iVar3 = atoi(argv[2]);
    lStep = iVar3;
    iVar4 = atoi(argv[3]);
    aStep = iVar4;
    bStep = atoi(argv[4]);
    if (iVar3 < 1 || (bStep < 1 || iVar4 < 1)) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Wrong argument! lStep, aStep and bStep must be positive.");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "Run this executable by invoking it like this: ");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50")
      ;
      std::endl<char,std::char_traits<char>>(poVar5);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      iVar3 = 1;
    }
    else {
      lVar6 = std::chrono::_V2::system_clock::now();
      cv::Mat::Mat(&imgRGB);
      iVar3 = 1;
      cv::imread((string *)&sstm,(int)&srcPath);
      cv::Mat::operator=(&imgRGB,(Mat *)&sstm);
      cv::Mat::~Mat((Mat *)&sstm);
      cVar2 = cv::Mat::empty();
      if (cVar2 == '\0') {
        cv::Mat::Mat(&imgLAB);
        local_690[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158[0].sz.width = 0;
        local_158[0].sz.height = 0;
        _sstm = 0x1010000;
        local_158[0].flags = 0x2010000;
        local_158[0].obj = &imgLAB;
        cv::cvtColor((cv *)&sstm,local_158,(_OutputArray *)0x2d,0,in_R8D);
        lVar12 = 0;
        do {
          cv::Mat::Mat((Mat *)((long)&local_158[0].flags + lVar12));
          lVar12 = lVar12 + 0x60;
        } while (lVar12 != 0x120);
        cv::split(&imgLAB,(Mat *)local_158);
        cv::Mat::Mat(&imgL,(Mat *)local_158);
        cv::Mat::Mat(&imgA,local_f8);
        cv::Mat::Mat(&imgB,local_98);
        cv::Mat::Mat(&lFiltered);
        local_690[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        _aFiltered = 0x2010000;
        cv::bilateralFilter((_InputArray *)&sstm,(_OutputArray *)&aFiltered,5,80.0,80.0,4);
        cv::Mat::operator=(&imgL,&lFiltered);
        cv::Mat::release();
        cv::Mat::Mat(&aFiltered);
        local_690[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        _bFiltered = 0x2010000;
        cv::bilateralFilter((_InputArray *)&sstm,(_OutputArray *)&bFiltered,5,80.0,80.0,4);
        cv::Mat::operator=(&imgA,&aFiltered);
        cv::Mat::release();
        cv::Mat::Mat(&bFiltered);
        local_690[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_698 = &imgLD;
        _sstm = 0x1010000;
        _imgLD = 0x2010000;
        cv::bilateralFilter((_InputArray *)&sstm,(_OutputArray *)local_698,5,80.0,80.0,4);
        cv::Mat::operator=(&imgB,&bFiltered);
        cv::Mat::release();
        cv::Mat::Mat(local_698);
        cv::Mat::Mat(&meanL);
        cv::Mat::Mat(&stdDevL);
        local_690[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x2010000;
        cv::Mat::convertTo((_OutputArray *)&imgL,(int)&sstm,1.0,0.0);
        local_690[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _sstm = 0x1010000;
        _maskAvgL = 0x2010000;
        _maskFinal = 0x2010000;
        pMStack_7c0 = &stdDevL;
        p_Var7 = (_InputArray *)cv::noArray();
        cv::meanStdDev((_InputArray *)&sstm,(_OutputArray *)&maskAvgL,(_OutputArray *)&maskFinal,
                       p_Var7);
        dVar1 = *local_448;
        std::operator<<((ostream *)&std::cout,"Mean lightness value: ");
        poVar5 = std::ostream::_M_insert<double>(*local_3e8);
        std::operator<<(poVar5,", standard deviation: ");
        poVar5 = std::ostream::_M_insert<double>(*local_448);
        poVar5 = std::operator<<(poVar5," useSTD: ");
        poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
        std::endl<char,std::char_traits<char>>(poVar5);
        local_6c8.height = (int)*local_728;
        local_6c8.width = (int)((ulong)*local_728 >> 0x20);
        cv::Mat_<unsigned_char>::zeros((Mat_<unsigned_char> *)&sstm,&local_6c8);
        cv::MatExpr::operator_cast_to_Mat((MatExpr *)&maskAvgL);
        cv::MatExpr::~MatExpr((MatExpr *)&sstm);
        iVar3 = 0;
        for (lVar12 = 0; local_820 = (int)&meanL, iStack_81c = (int)((ulong)&meanL >> 0x20),
            lVar12 < local_820; lVar12 = lVar12 + 1) {
          for (lVar11 = 0; lVar11 < iStack_81c; lVar11 = lVar11 + 1) {
            dVar14 = *local_3e8;
            if (42.5 <= dVar1) {
              dVar14 = dVar14 + *local_448 / -3.0;
            }
            if (dVar14 <= *(double *)(*local_350 * lVar12 + lVar11 * 8)) {
              *(undefined1 *)(lVar11 + *local_7e0 * lVar12) = 0;
            }
            else {
              *(char *)(lVar11 + *local_7e0 * lVar12) =
                   *(char *)(lVar11 + *local_720 * lVar12 + local_758) + '\x01';
              iVar3 = iVar3 + 1;
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sstm,"../results/mask_step_one.jpg",(allocator<char> *)&s);
        _maskFinal = 0x1010000;
        pMStack_7c0 = &maskAvgL;
        labMap._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        cv::imwrite((string *)&sstm,(_InputArray *)&maskFinal,(vector *)&labMap);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&labMap);
        std::__cxx11::string::~string((string *)&sstm);
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &labMap._M_t._M_impl.super__Rb_tree_header._M_header;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        labMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (lVar12 = 0; lVar12 < local_820; lVar12 = lVar12 + 1) {
          for (lVar11 = 0; lVar11 < iStack_81c; lVar11 = lVar11 + 1) {
            if (*(char *)(lVar11 + *local_7e0 * lVar12) != '\0') {
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = (int)lVar11;
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = (int)lVar12;
              s._M_dataplus._M_p._0_4_ =
                   (int)((long)(ulong)*(byte *)(lVar11 + *local_4d0 * lVar12 + local_508) /
                        (long)bStep);
              s._M_dataplus._M_p._4_4_ =
                   (int)((long)(ulong)*(byte *)(lVar11 + *local_470 * lVar12 + local_4a8) /
                        (long)aStep);
              s._M_string_length._0_4_ =
                   (undefined4)
                   ((long)(ulong)*(byte *)(lVar11 + *local_720 * lVar12 + local_758) / (long)lStep);
              iVar8 = std::
                      _Rb_tree<std::tuple<int,_int,_int>,_std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                      ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                              *)&labMap,(key_type *)&s);
              if ((_Rb_tree_header *)iVar8._M_node == &labMap._M_t._M_impl.super__Rb_tree_header) {
                _maskFinal = (undefined1  [16])0x0;
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&maskFinal,
                           (value_type *)&threads);
                local_698 = (Mat *)CONCAT44(local_698._4_4_,(undefined4)s._M_string_length);
                _Stack_69c._M_head_impl = s._M_dataplus._M_p._4_4_;
                _sstm = s._M_dataplus._M_p._0_4_;
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_690,
                           (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&maskFinal)
                ;
                std::
                _Rb_tree<std::tuple<int,int,int>,std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,std::_Select1st<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>,std::less<std::tuple<int,int,int>>,std::allocator<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>
                ::
                _M_emplace_unique<std::pair<std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                          ((_Rb_tree<std::tuple<int,int,int>,std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,std::_Select1st<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>,std::less<std::tuple<int,int,int>>,std::allocator<std::pair<std::tuple<int,int,int>const,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>>
                            *)&labMap,
                           (pair<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                            *)&sstm);
                std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                          (local_690);
                std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                          ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                           &maskFinal);
              }
              else {
                this = std::
                       map<std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                       ::operator[](&labMap,(key_type *)&s);
                std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                          (this,(value_type *)&threads);
              }
            }
          }
        }
        iVar4 = 0;
        for (p_Var9 = labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &labMap._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&sstm,
                     (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                     &p_Var9[1]._M_left);
          iVar4 = iVar4 + (int)((ulong)((long)local_698 - (long)_sstm) >> 3);
          std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                    ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&sstm);
        }
        if (iVar3 == iVar4) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "labMap succesfully created. Entries in labMap: ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        iVar3 = std::thread::hardware_concurrency();
        poVar5 = std::operator<<((ostream *)&std::cout,"Max threads concurrent: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        std::endl<char,std::char_traits<char>>(poVar5);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var9 = labMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while ((_Rb_tree_header *)p_Var9 != &labMap._M_t._M_impl.super__Rb_tree_header) {
          if ((ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)(long)iVar3) {
            _maskFinal = &shadowPoints;
            std::thread::
            thread<void(&)(cv::Mat,cv::Mat,cv::Mat,std::tuple<int,int,int>,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,int,int,int,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&),cv::Mat&,cv::Mat&,cv::Mat&,std::tuple<int,int,int>const&,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>&,int_const&,int_const&,int_const&,std::reference_wrapper<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,void>
                      ((thread *)&sstm,findShadow,&imgL,&imgA,&imgB,
                       (tuple<int,_int,_int> *)(p_Var9 + 1),
                       (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                       &p_Var9[1]._M_left,&lStep,&aStep,&bStep,
                       (reference_wrapper<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                        *)&maskFinal);
            std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                      (&threads,(thread *)&sstm);
            std::thread::~thread((thread *)&sstm);
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          }
          else {
            for (uVar13 = 0;
                uVar13 < (ulong)((long)threads.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)threads.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
                uVar13 = uVar13 + 1) {
              std::thread::join();
            }
            std::vector<std::thread,_std::allocator<std::thread>_>::erase
                      (&threads,(const_iterator)
                                threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                       (const_iterator)
                       threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish);
          }
        }
        uVar13 = 0;
        while( true ) {
          if ((ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar13) break;
          std::thread::join();
          uVar13 = uVar13 + 1;
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::erase
                  (&threads,(const_iterator)
                            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                   (const_iterator)
                   threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        local_6d0.height = (int)*local_7e8;
        local_6d0.width = (int)((ulong)*local_7e8 >> 0x20);
        cv::Mat_<unsigned_char>::zeros((Mat_<unsigned_char> *)&sstm,&local_6d0);
        cv::MatExpr::operator_cast_to_Mat((MatExpr *)&maskFinal);
        cv::MatExpr::~MatExpr((MatExpr *)&sstm);
        for (uVar13 = 0;
            uVar13 < (ulong)((long)shadowPoints.
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)shadowPoints.
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar13 = uVar13 + 1) {
          *(undefined1 *)
           ((long)shadowPoints.
                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13].y +
           (long)shadowPoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].x * *local_780) = 0xff;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&sstm);
        poVar5 = std::operator<<((ostream *)local_690,"../results/mask_step_two_lStep");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,lStep);
        poVar5 = std::operator<<(poVar5,"_aStep");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,aStep);
        poVar5 = std::operator<<(poVar5,"_bStep");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,bStep);
        std::operator<<(poVar5,".jpg");
        std::__cxx11::stringbuf::str();
        local_6d8.width = 0;
        local_6d8.height = 0;
        end_time = CONCAT44(end_time._4_4_,0x1010000);
        local_708._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_708._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_708._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_6e0 = (MatExpr *)&maskFinal;
        cv::imwrite((string *)&s,(_InputArray *)&end_time,(vector *)&local_708);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_708);
        lVar12 = std::chrono::_V2::system_clock::now();
        end_time = lVar12 / 1000000000;
        poVar5 = std::operator<<((ostream *)&std::cout,"Finished computation at ");
        pcVar10 = ctime(&end_time);
        poVar5 = std::operator<<(poVar5,pcVar10);
        poVar5 = std::operator<<(poVar5," Elapsed time: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)((lVar12 - lVar6) / 1000000));
        poVar5 = std::operator<<(poVar5," ms");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&s);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sstm);
        cv::Mat::~Mat(&maskFinal);
        std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
                  (&shadowPoints.
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
        std::
        _Rb_tree<std::tuple<int,_int,_int>,_std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_int>,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
        ::~_Rb_tree(&labMap._M_t);
        cv::Mat::~Mat(&maskAvgL);
        cv::Mat::~Mat(&stdDevL);
        cv::Mat::~Mat(&meanL);
        cv::Mat::~Mat(&imgLD);
        cv::Mat::~Mat(&bFiltered);
        cv::Mat::~Mat(&aFiltered);
        cv::Mat::~Mat(&lFiltered);
        cv::Mat::~Mat(&imgB);
        cv::Mat::~Mat(&imgA);
        cv::Mat::~Mat(&imgL);
        lVar6 = 0xc0;
        do {
          cv::Mat::~Mat((Mat *)((long)&local_158[0].flags + lVar6));
          lVar6 = lVar6 + -0x60;
        } while (lVar6 != -0x60);
        cv::Mat::~Mat(&imgLAB);
        iVar3 = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Wrong argument! Can not open input image. Check for errors in the provided path"
                                );
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "Run this executable by invoking it like this: ");
        std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 50 50 50"
                                );
        std::endl<char,std::char_traits<char>>(poVar5);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      cv::Mat::~Mat(&imgRGB);
    }
    std::__cxx11::string::~string((string *)&srcPath);
  }
  else {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<((ostream *)&std::cout,"Run this executable by invoking it like this: ")
    ;
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<((ostream *)&std::cout,"The first argument is the input image path.");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "The second argument is the lStep parameter. It must be positive.");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "The third argument is the aStep parameter. It must be positive.");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "The fourth argument is the bStep parameter. It must be positive.");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv){

  if (argc != 5){
    cout << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50" << endl;
    cout << endl;
    cout << "The first argument is the input image path." << endl;
    cout << "The second argument is the lStep parameter. It must be positive." << endl;
    cout << "The third argument is the aStep parameter. It must be positive." << endl;
    cout << "The fourth argument is the bStep parameter. It must be positive." << endl;
    cout << endl;
    return 1;
  }

  const string srcPath = argv[1];
  const int lStep = atoi(argv[2]);
  const int aStep = atoi(argv[3]);
  const int bStep = atoi(argv[4]);

  if(aStep <= 0 || bStep <=0 || lStep <= 0){
    cout << endl;
    cout << "Wrong argument! lStep, aStep and bStep must be positive." << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 20 50 50" << endl;
    cout << endl;
    return 1;
  }

  chrono::time_point<chrono::system_clock> start, end;
  start = chrono::system_clock::now();

  Mat imgRGB;
  imgRGB = imread(srcPath);

  if(imgRGB.empty()){
    cout << "Wrong argument! Can not open input image. Check for errors in the provided path" << endl;
    cout << "Run this executable by invoking it like this: " << endl;
    cout << "   ./ShadowDet ../data/flickr-4159721472_c55deb37d6_b.jpg 50 50 50" << endl;
    cout << endl;
    return 1;
  }

  // in this process we use CIE LAB color space
  Mat imgLAB;
  cvtColor(imgRGB, imgLAB, COLOR_RGB2Lab);

  Mat channelLAB[3];
  split(imgLAB, channelLAB);
  Mat imgL = channelLAB[0];
  Mat imgA = channelLAB[1];
  Mat imgB = channelLAB[2];

  //bilateral filter to reduce noise but preserve edges
  Mat lFiltered;
  bilateralFilter(imgL, lFiltered, 5, 80, 80);
  imgL = lFiltered;
  lFiltered.release();

  Mat aFiltered;
  bilateralFilter(imgA, aFiltered, 5, 80, 80);
  imgA = aFiltered;
  aFiltered.release();

  Mat bFiltered;
  bilateralFilter(imgB, bFiltered, 5, 80, 80);
  imgB = bFiltered;
  bFiltered.release();

  // compute the mean and the standard deviation of the luminance component
  // these values are considered as the "background light" so they allow to
  // distinguish "probably shadow pixels" (PSP) from surely "not shadow pixels" (NSP)
  Mat imgLD, meanL, stdDevL;
  bool useSTD = true;
  imgL.convertTo(imgLD, CV_64FC1);
  meanStdDev(imgLD, meanL, stdDevL);
  if(stdDevL.at<double> (0, 0) <  (double) 255 / 6){
    useSTD = false;
  }

  cout << "Mean lightness value: " << meanL.at<double> (0, 0) << ", standard deviation: " << stdDevL.at<double> (0, 0)
       << " useSTD: " << useSTD << endl;

  // create the mask
  Mat maskAvgL = Mat_<uchar>::zeros(imgL.size());

  // depending on the standard deviation on imgL, each pixel with lightness component less than meanL - stdDevL/3
  // or simply meanL is a PSP, otherwise it is a NSP.
  // in the resulting masks, each PSP value is set to the one assumed in the luminance image plus 1
  // while each NSP remains set to 0
  int maskPixels = 0;
  for(int i = 0; i < maskAvgL.rows; i++){
    for(int j = 0; j < maskAvgL.cols; j++){
      if(useSTD){
        if(imgLD.at<double> (i, j) < (meanL.at<double> (0, 0) - (stdDevL.at<double> (0, 0) / 3))){
          maskAvgL.at<uchar> (i, j) = 1 + imgL.at<uchar> (i, j);
          maskPixels++;
        }
        else{
          maskAvgL.at<uchar> (i, j) = 0;
        }
      }
      else{
        if(imgLD.at<double> (i, j) < meanL.at<double> (0, 0)){
          maskAvgL.at<uchar> (i, j) = 1 + imgL.at<uchar> (i, j);
          maskPixels++;
        }
        else{
          maskAvgL.at<uchar> (i, j) = 0;
        }
      }
    }
  }

  // write the files to see results
  imwrite("../results/mask_step_one.jpg", maskAvgL);

  // now further computation to detect the shadow pixels (SP) from the PSP
  map<tuple<int, int, int> , vector<Point> > labMap;
  map<tuple<int, int, int>, vector<Point> >::iterator labIt;

  // fill  labMap:
  // key = (l*, a*, b*) pixel component. It represents a color bin
  // value = points of the mask in the bin
  for (int i = 0; i < maskAvgL.rows; i++){
    for (int j = 0; j < maskAvgL.cols; j++){
      if (maskAvgL.at<uchar> (i, j) != 0){
        Point p(i, j);
        int theL = ceil(imgL.at<uchar> (i, j) / lStep);
        int theA = ceil(imgA.at<uchar> (i, j) / aStep);
        int theB = ceil(imgB.at<uchar> (i, j) / bStep);
        tuple<int, int, int> key = make_tuple(theL, theA, theB);

        labIt = labMap.find(key);
        if(labIt == labMap.end()){
          vector<Point> v;
          v.push_back(p);
          labMap.insert(pair<tuple<int, int, int>, vector<Point> >(key, v));
        }
        else{
          labMap[key].push_back(p);
        }
      }
    }
  }

  int labMapPixels = 0;
  for (labIt = labMap.begin(); labIt != labMap.end(); labIt++){
    vector<Point> labPixels = labIt->second;
    labMapPixels = labMapPixels + labPixels.size();
  }

  if(maskPixels == labMapPixels){
    cout << "labMap succesfully created. Entries in labMap: " << labMap.size() << endl;
  }

  // use thread pool to analyze each (key, value) pair in labMap
  const int poolSize = thread::hardware_concurrency();
  cout << "Max threads concurrent: " << poolSize << endl;
  vector<thread> threads;
  vector<Point> shadowPoints;
  labIt = labMap.begin();

  while(labIt != labMap.end()){
    if(threads.size() < poolSize){
      // lauch thread form the pool. See FindShadow.cpp for more information
      threads.push_back(thread(findShadow, imgL, imgA, imgB, labIt->first, labIt->second, lStep, aStep, bStep, ref(shadowPoints)));
      labIt++; // move to the next (key, value) pair in labMap
    }
    else{
      // wait for threads to finish their computation
      for(int t = 0; t < threads.size(); t++){
        threads[t].join();
      }
      // free the pool
      threads.erase(threads.begin(), threads.end());
    }
  }

  // wait for active threads remaining
  for(int t = 0; t < threads.size(); t++){
    threads[t].join();
  }
  // free the pool
  threads.erase(threads.begin(), threads.end());

  // write the final result
  Mat maskFinal = Mat_<uchar>::zeros(maskAvgL.size());

  for (int i = 0; i < shadowPoints.size(); i++){
    Point p = shadowPoints[i];
    maskFinal.at<uchar> (p.x, p.y) = 255;
  }

  stringstream sstm;
  sstm << "../results/mask_step_two_lStep" << lStep << "_aStep" << aStep << "_bStep" << bStep << ".jpg";
  string s = sstm.str();
  imwrite(s, maskFinal);

  // provide information to the user
  end = chrono::system_clock::now();
  int elapsed_seconds = chrono::duration_cast<std::chrono::milliseconds> (end-start).count();
  time_t end_time = chrono::system_clock::to_time_t(end);

  cout << "Finished computation at " << ctime(&end_time) << " Elapsed time: " << elapsed_seconds << " ms" << endl;

  return 0;
}